

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

uint mp_hs_integer(mp_int *x,uintmax_t n)

{
  size_t sVar1;
  uintmax_t uVar2;
  BignumInt BVar3;
  BignumDblInt ADC_temp;
  BignumInt dummy_out;
  BignumInt nword;
  size_t e;
  size_t i;
  size_t nwords;
  BignumInt carry;
  uintmax_t n_local;
  mp_int *x_local;
  
  nwords = 1;
  e = 0;
  sVar1 = size_t_max(x->nw,1);
  carry = n;
  for (; e < sVar1; e = e + 1) {
    uVar2 = shift_right_by_one_word(carry);
    BVar3 = mp_word(x,e);
    nwords = (ulong)CARRY8(BVar3,~carry) + (ulong)CARRY8(BVar3 + ~carry,nwords);
    carry = uVar2;
  }
  return (uint)nwords;
}

Assistant:

unsigned mp_hs_integer(mp_int *x, uintmax_t n)
{
    BignumInt carry = 1;
    size_t nwords = sizeof(n)/BIGNUM_INT_BYTES;
    for (size_t i = 0, e = size_t_max(x->nw, nwords); i < e; i++) {
        BignumInt nword = n;
        n = shift_right_by_one_word(n);
        BignumInt dummy_out;
        BignumADC(dummy_out, carry, mp_word(x, i), ~nword, carry);
        (void)dummy_out;
    }
    return carry;
}